

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_>::
     dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  void *pvVar2;
  ulong uVar3;
  align_val_t aVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  instance *piVar5;
  byte bVar6;
  
  bVar6 = v_h->inst->field_0x30;
  if ((bVar6 & 2) == 0) {
    bVar6 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar6 = bVar6 >> 2;
  }
  if ((bVar6 & 1) == 0) {
    pvVar2 = *v_h->vh;
    uVar3 = v_h->type->type_size;
    aVar4 = v_h->type->type_align;
    if (aVar4 < 0x11) {
      operator_delete(pvVar2,uVar3);
    }
    else {
      operator_delete(pvVar2,uVar3,aVar4);
    }
  }
  else {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v_h->vh[2];
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    piVar5 = v_h->inst;
    if ((piVar5->field_0x30 & 2) == 0) {
      pbVar1 = (piVar5->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar5->field_0x30 = piVar5->field_0x30 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }